

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<LibrarySearchPath>::moveAppend
          (QGenericArrayOps<LibrarySearchPath> *this,LibrarySearchPath *b,LibrarySearchPath *e)

{
  LibrarySearchPath *pLVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pLVar1 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
    qVar5 = (this->super_QArrayDataPointer<LibrarySearchPath>).size;
    do {
      pDVar2 = (b->super_QMakeLocalFileName).real_name.d.d;
      (b->super_QMakeLocalFileName).real_name.d.d = (Data *)0x0;
      pLVar1[qVar5].super_QMakeLocalFileName.real_name.d.d = pDVar2;
      pcVar3 = (b->super_QMakeLocalFileName).real_name.d.ptr;
      (b->super_QMakeLocalFileName).real_name.d.ptr = (char16_t *)0x0;
      pLVar1[qVar5].super_QMakeLocalFileName.real_name.d.ptr = pcVar3;
      qVar4 = (b->super_QMakeLocalFileName).real_name.d.size;
      (b->super_QMakeLocalFileName).real_name.d.size = 0;
      pLVar1[qVar5].super_QMakeLocalFileName.real_name.d.size = qVar4;
      pDVar2 = (b->super_QMakeLocalFileName).local_name.d.d;
      (b->super_QMakeLocalFileName).local_name.d.d = (Data *)0x0;
      pLVar1[qVar5].super_QMakeLocalFileName.local_name.d.d = pDVar2;
      pcVar3 = (b->super_QMakeLocalFileName).local_name.d.ptr;
      (b->super_QMakeLocalFileName).local_name.d.ptr = (char16_t *)0x0;
      pLVar1[qVar5].super_QMakeLocalFileName.local_name.d.ptr = pcVar3;
      qVar4 = (b->super_QMakeLocalFileName).local_name.d.size;
      (b->super_QMakeLocalFileName).local_name.d.size = 0;
      pLVar1[qVar5].super_QMakeLocalFileName.local_name.d.size = qVar4;
      pLVar1[qVar5]._default = b->_default;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<LibrarySearchPath>).size + 1;
      (this->super_QArrayDataPointer<LibrarySearchPath>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }